

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_embedded.cc
# Opt level: O0

void __thiscall EmbeddedCode::GenCode(EmbeddedCode *this,Output *out,Env *env)

{
  Output *this_00;
  bool bVar1;
  ulong uVar2;
  void *pvVar3;
  undefined8 uVar4;
  Env *in_RDX;
  Output *in_RSI;
  long in_RDI;
  EmbeddedCodeSegment *segment;
  iterator i;
  string *in_stack_ffffffffffffff68;
  EmbeddedCodeSegment *in_stack_ffffffffffffff70;
  string local_68 [8];
  Env *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  __normal_iterator<EmbeddedCodeSegment_**,_std::vector<EmbeddedCodeSegment_*,_std::allocator<EmbeddedCodeSegment_*>_>_>
  local_38 [3];
  void *local_20;
  Env *local_18;
  Output *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pvVar3 = operator_new(0x28);
    EmbeddedCodeSegment::EmbeddedCodeSegment(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_20 = pvVar3;
    std::vector<EmbeddedCodeSegment_*,_std::allocator<EmbeddedCodeSegment_*>_>::push_back
              ((vector<EmbeddedCodeSegment_*,_std::allocator<EmbeddedCodeSegment_*>_> *)
               in_stack_ffffffffffffff70,(value_type *)in_stack_ffffffffffffff68);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x48),"");
  }
  Env::set_allow_undefined_id(local_18,true);
  if (*(long *)(in_RDI + 0x68) != 0) {
    local_38[0]._M_current =
         (EmbeddedCodeSegment **)
         std::vector<EmbeddedCodeSegment_*,_std::allocator<EmbeddedCodeSegment_*>_>::begin
                   ((vector<EmbeddedCodeSegment_*,_std::allocator<EmbeddedCodeSegment_*>_> *)
                    in_stack_ffffffffffffff68);
    while( true ) {
      std::vector<EmbeddedCodeSegment_*,_std::allocator<EmbeddedCodeSegment_*>_>::end
                ((vector<EmbeddedCodeSegment_*,_std::allocator<EmbeddedCodeSegment_*>_> *)
                 in_stack_ffffffffffffff68);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<EmbeddedCodeSegment_**,_std::vector<EmbeddedCodeSegment_*,_std::allocator<EmbeddedCodeSegment_*>_>_>
                          *)in_stack_ffffffffffffff70,
                         (__normal_iterator<EmbeddedCodeSegment_**,_std::vector<EmbeddedCodeSegment_*,_std::allocator<EmbeddedCodeSegment_*>_>_>
                          *)in_stack_ffffffffffffff68);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<EmbeddedCodeSegment_**,_std::vector<EmbeddedCodeSegment_*,_std::allocator<EmbeddedCodeSegment_*>_>_>
      ::operator*(local_38);
      this_00 = local_10;
      in_stack_ffffffffffffff70 = (EmbeddedCodeSegment *)local_68;
      EmbeddedCodeSegment::ToCode_abi_cxx11_
                ((EmbeddedCodeSegment *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      uVar4 = std::__cxx11::string::c_str();
      Output::print(this_00,"%s",uVar4);
      std::__cxx11::string::~string(local_68);
      __gnu_cxx::
      __normal_iterator<EmbeddedCodeSegment_**,_std::vector<EmbeddedCodeSegment_*,_std::allocator<EmbeddedCodeSegment_*>_>_>
      ::operator++(local_38);
    }
  }
  Env::set_allow_undefined_id(local_18,false);
  Output::print(local_10,"\n");
  return;
}

Assistant:

void EmbeddedCode::GenCode(Output* out, Env* env)
	{
	if ( ! current_segment_.empty() )
		{
		segments_->push_back(new EmbeddedCodeSegment(current_segment_));
		current_segment_ = "";
		}

	// TODO: return to the generated file after embedded code
	// out->print("#line %d \"%s\"\n", line_num, filename.c_str());

	// Allow use of RValue for undefined ID, in which case the
	// ID's name is used as its RValue
	env->set_allow_undefined_id(true);

	foreach (i, EmbeddedCodeSegmentList, segments_)
		{
		EmbeddedCodeSegment* segment = *i;
		out->print("%s", segment->ToCode(env).c_str());
		}

	env->set_allow_undefined_id(false);
	out->print("\n");
	}